

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O1

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 local_20 [16];
  
  local_20[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_20;
  CoreApp(this,DEFAULT,(string_view)(auVar1 << 0x40),argc,argv);
  return;
}

Assistant:

CoreApp::CoreApp(int argc, char* argv[]): CoreApp(CoreType::DEFAULT, std::string{}, argc, argv) {}